

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Expression * __thiscall
ot::commissioner::Interpreter::Read_abi_cxx11_(Expression *__return_storage_ptr__,Interpreter *this)

{
  string local_30;
  
  Console::Read_abi_cxx11_();
  ParseExpression(__return_storage_ptr__,this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Expression Interpreter::Read()
{
    return ParseExpression(Console::Read());
}